

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

clause * solver2_propagate(sat_solver2 *s)

{
  ABC_INT64_T *pAVar1;
  clause cVar2;
  veci *pvVar3;
  char *pcVar4;
  veci *pvVar5;
  clause cVar6;
  uint uVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  clause *pcVar13;
  uint uVar14;
  clause *c;
  uint *puVar15;
  long lVar16;
  clause cVar17;
  uint *puVar18;
  clause *pcVar19;
  ulong uVar20;
  uint *puVar21;
  int iVar22;
  bool bVar23;
  int Lit;
  clause local_64;
  uint *local_60;
  ulong local_58;
  uint local_4c;
  veci *local_48;
  clause *local_40;
  long local_38;
  
  do {
    iVar22 = s->qhead;
    if (s->qtail <= iVar22) {
      return (clause *)0x0;
    }
    pvVar3 = s->wlists;
    s->qhead = iVar22 + 1;
    uVar10 = s->trail[iVar22];
    local_48 = pvVar3 + (int)uVar10;
    puVar18 = (uint *)pvVar3[(int)uVar10].ptr;
    iVar22 = pvVar3[(int)uVar10].size;
    pAVar1 = &(s->stats).propagations;
    *pAVar1 = *pAVar1 + 1;
    puVar21 = puVar18;
    if ((long)iVar22 < 1) {
      pcVar19 = (clause *)0x0;
    }
    else {
      puVar15 = puVar18 + iVar22;
      uVar20 = (ulong)(uVar10 ^ 1);
      pcVar19 = (clause *)0x0;
      local_60 = puVar15;
      local_58 = uVar20;
      do {
        uVar10 = *puVar18;
        if (uVar10 == 0) {
          c = (clause *)0x0;
        }
        else {
          uVar7 = (s->Mem).uPageMask & uVar10;
          if (uVar7 == 0) goto LAB_004f6254;
          c = (clause *)
              ((s->Mem).pPages[(int)uVar10 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar7);
        }
        cVar6 = c[1];
        cVar2 = c[2];
        cVar17 = SUB84(uVar20,0);
        if (cVar6 == cVar17) {
          c[1] = cVar2;
          c[2] = cVar17;
          cVar6 = cVar2;
        }
        else if (cVar2 != cVar17) {
          __assert_fail("lits[1] == false_lit",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                        ,0x3a2,"clause *solver2_propagate(sat_solver2 *)");
        }
        iVar22 = (int)cVar6 >> 1;
        pcVar4 = s->assigns;
        lVar16 = (long)iVar22;
        if (((uint)cVar6 & 1) == (int)pcVar4[lVar16]) {
          *puVar21 = *puVar18;
          puVar21 = puVar21 + 1;
        }
        else {
          uVar10 = (uint)*c >> 9 & 0xfffffffc;
          local_38 = lVar16;
          if (8 < uVar10) {
            pcVar13 = c + 3;
            do {
              cVar2 = *pcVar13;
              if (((uint)cVar2 & 1 ^ (int)pcVar4[(int)cVar2 >> 1]) != 1) {
                c[2] = cVar2;
                *pcVar13 = cVar17;
                uVar9 = (long)(int)c[2] ^ 1;
                pvVar5 = s->wlists;
                pvVar3 = pvVar5 + uVar9;
                uVar10 = *puVar18;
                uVar7 = pvVar5[uVar9].size;
                if (uVar7 == pvVar5[uVar9].cap) {
                  iVar22 = (uVar7 >> 1) * 3;
                  if ((int)uVar7 < 4) {
                    iVar22 = uVar7 * 2;
                  }
                  if (pvVar3->ptr == (int *)0x0) {
                    piVar8 = (int *)malloc((long)iVar22 << 2);
                  }
                  else {
                    piVar8 = (int *)realloc(pvVar3->ptr,(long)iVar22 << 2);
                  }
                  pvVar3->ptr = piVar8;
                  if (piVar8 == (int *)0x0) {
                    printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                           (double)pvVar3->cap * 9.5367431640625e-07,
                           (double)iVar22 * 9.5367431640625e-07);
                    fflush(_stdout);
                  }
                  pvVar3->cap = iVar22;
                  uVar7 = pvVar3->size;
                  uVar20 = local_58;
                }
                pvVar3->size = uVar7 + 1;
                pvVar3->ptr[(int)uVar7] = uVar10;
                puVar15 = local_60;
                goto LAB_004f61ec;
              }
              pcVar13 = pcVar13 + 1;
            } while (pcVar13 < (clause *)(&c[1].field_0x0 + uVar10));
          }
          local_64 = cVar6;
          if ((s->fProofLogging != 0) && ((s->trail_lim).size == 0)) {
            local_4c = (uint)pcVar4[lVar16];
            local_40 = pcVar19;
            proof_chain_start(s,c);
            if (0xfff < (uint)*c) {
              uVar20 = 1;
              do {
                if ((uint)c[uVar20 + 1] < 2) break;
                iVar11 = (int)c[uVar20 + 1] >> 1;
                if (s->levels[iVar11] != 0) {
                  __assert_fail("var_level(s, x) == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                                ,0x3bb,"clause *solver2_propagate(sat_solver2 *)");
                }
                proof_chain_resolve(s,(clause *)0x0,iVar11);
                uVar20 = uVar20 + 1;
              } while (uVar20 < (uint)*c >> 0xb);
            }
            uVar14 = (uint)cVar6 & 1 ^ local_4c;
            iVar11 = proof_chain_stop(s);
            uVar7 = clause2_create_new(s,(lit *)&local_64,(lit *)&local_60,1,iVar11);
            pcVar19 = local_40;
            uVar10 = s->units[local_38];
            if (uVar10 == 0) {
              if (uVar14 == 1) {
LAB_004f62b1:
                __assert_fail("(var_unit_clause(s, Var) == NULL) != fLitIsFalse",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                              ,0x3c1,"clause *solver2_propagate(sat_solver2 *)");
              }
              if ((iVar22 < 0) || (s->size <= iVar22)) {
                __assert_fail("v >= 0 && v < s->size && !s->units[v]",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                              ,0x99,"void var_set_unit_clause(sat_solver2 *, int, cla)");
              }
              s->units[local_38] = uVar7;
              s->nUnits = s->nUnits + 1;
              uVar20 = local_58;
            }
            else {
              uVar12 = (s->Mem).uPageMask;
              if ((uVar12 & uVar10) == 0) goto LAB_004f6254;
              if (uVar14 != 1) goto LAB_004f62b1;
              if (uVar7 == 0) {
                pcVar13 = (clause *)0x0;
              }
              else {
                uVar12 = uVar12 & uVar7;
                if (uVar12 == 0) goto LAB_004f6254;
                pcVar13 = (clause *)
                          ((s->Mem).pPages[(int)uVar7 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                          (int)uVar12);
              }
              proof_chain_start(s,pcVar13);
              proof_chain_resolve(s,(clause *)0x0,iVar22);
              iVar22 = proof_chain_stop(s);
              s->hProofLast = iVar22;
              uVar20 = local_58;
            }
          }
          *puVar21 = *puVar18;
          cVar6 = *c;
          if (((uint)cVar6 & 1) != 0) {
            uVar10 = 0;
            if (0x7ff < (uint)cVar6) {
              uVar20 = 0;
              uVar10 = 0;
              uVar7 = 0;
              do {
                uVar14 = 1 << ((byte)s->levels[(int)c[uVar20 + 1] >> 1] & 0x1f);
                bVar23 = (uVar7 >> (s->levels[(int)c[uVar20 + 1] >> 1] & 0x1fU) & 1) != 0;
                if (bVar23) {
                  uVar14 = 0;
                }
                uVar10 = (uVar10 + 1) - (uint)bVar23;
                uVar7 = uVar7 | uVar14;
                uVar20 = uVar20 + 1;
              } while ((uint)cVar6 >> 0xb != uVar20);
              uVar10 = (uVar10 & 0xff) << 3;
              uVar20 = local_58;
            }
            *c = (clause)((uint)cVar6 & 0xfffff807 | uVar10);
          }
          puVar21 = puVar21 + 1;
          iVar22 = (int)local_64 >> 1;
          uVar10 = (uint)s->assigns[iVar22];
          puVar15 = local_60;
          if (uVar10 == 3) {
            uVar10 = *puVar18;
            s->assigns[iVar22] = local_64._0_1_ & 1;
            s->levels[iVar22] = (s->trail_lim).size;
            s->reasons[iVar22] = uVar10;
            iVar22 = s->qtail;
            s->qtail = iVar22 + 1;
            *(clause *)(s->trail + iVar22) = local_64;
          }
          else if (((uint)local_64 & 1) != uVar10) {
            uVar10 = *puVar18;
            if (uVar10 == 0) {
              pcVar19 = (clause *)0x0;
            }
            else {
              uVar7 = (s->Mem).uPageMask & uVar10;
              if (uVar7 == 0) {
LAB_004f6254:
                __assert_fail("k",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satClause.h"
                              ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
              }
              pcVar19 = (clause *)
                        ((s->Mem).pPages[(int)uVar10 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                        (int)uVar7);
            }
            while (puVar18 = puVar18 + 1, puVar18 < local_60) {
              *puVar21 = *puVar18;
              puVar21 = puVar21 + 1;
            }
          }
        }
LAB_004f61ec:
        puVar18 = puVar18 + 1;
      } while (puVar18 < puVar15);
      puVar18 = (uint *)local_48->ptr;
      iVar22 = local_48->size;
    }
    pAVar1 = &(s->stats).inspects;
    *pAVar1 = *pAVar1 + ((long)puVar21 - (long)puVar18 >> 2);
    iVar11 = (int)((ulong)((long)puVar21 - (long)puVar18) >> 2);
    if (iVar22 < iVar11) {
      __assert_fail("k <= v->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satVec.h"
                    ,0x30,"void veci_resize(veci *, int)");
    }
    local_48->size = iVar11;
    if (pcVar19 != (clause *)0x0) {
      return pcVar19;
    }
  } while( true );
}

Assistant:

clause* solver2_propagate(sat_solver2* s)
{
    clause* c, * confl  = NULL;
    veci* ws;
    lit* lits, false_lit, p, * stop, * k;
    cla* begin,* end, *i, *j;
    int Lit;

    while (confl == 0 && s->qtail - s->qhead > 0){

        p  = s->trail[s->qhead++];
        ws = solver2_wlist(s,p);
        begin = (cla*)veci_begin(ws);
        end   = begin + veci_size(ws);

        s->stats.propagations++;
        for (i = j = begin; i < end; ){
            c = clause2_read(s,*i);
            lits = c->lits;

            // Make sure the false literal is data[1]:
            false_lit = lit_neg(p);
            if (lits[0] == false_lit){
                lits[0] = lits[1];
                lits[1] = false_lit;
            }
            assert(lits[1] == false_lit);

            // If 0th watch is true, then clause is already satisfied.
            if (var_value(s, lit_var(lits[0])) == lit_sign(lits[0]))
                *j++ = *i;
            else{
                // Look for new watch:
                stop = lits + c->size;
                for (k = lits + 2; k < stop; k++){
                    if (var_value(s, lit_var(*k)) != !lit_sign(*k)){
                        lits[1] = *k;
                        *k = false_lit;
                        veci_push(solver2_wlist(s,lit_neg(lits[1])),*i);
                        goto WatchFound; }
                }

                // Did not find watch -- clause is unit under assignment:
                Lit = lits[0];
                if ( s->fProofLogging && solver2_dlevel(s) == 0 )
                {
                    int k, x, proof_id, Cid, Var = lit_var(Lit);
                    int fLitIsFalse = (var_value(s, Var) == !lit_sign(Lit));
                    // Log production of top-level unit clause:
                    proof_chain_start( s, c );
                    clause_foreach_var( c, x, k, 1 ){
                        assert( var_level(s, x) == 0 );
                        proof_chain_resolve( s, NULL, x );
                    }
                    proof_id = proof_chain_stop( s );
                    // get a new clause
                    Cid = clause2_create_new( s, &Lit, &Lit + 1, 1, proof_id );
                    assert( (var_unit_clause(s, Var) == NULL) != fLitIsFalse );
                    // if variable already has unit clause, it must be with the other polarity 
                    // in this case, we should derive the empty clause here
                    if ( var_unit_clause(s, Var) == NULL )
                        var_set_unit_clause(s, Var, Cid);
                    else{
                        // Empty clause derived:
                        proof_chain_start( s, clause2_read(s,Cid) );
                        proof_chain_resolve( s, NULL, Var );
                        proof_id = proof_chain_stop( s );
                        s->hProofLast = proof_id;
//                        clause2_create_new( s, &Lit, &Lit, 1, proof_id );
                    }
                }

                *j++ = *i;
                // Clause is unit under assignment:
                if ( c->lrn )
                    c->lbd = sat_clause_compute_lbd(s, c);
                if (!solver2_enqueue(s,Lit, *i)){
                    confl = clause2_read(s,*i++);
                    // Copy the remaining watches:
                    while (i < end)
                        *j++ = *i++;
                }
            }
WatchFound: i++;
        }
        s->stats.inspects += j - (int*)veci_begin(ws);
        veci_resize(ws,j - (int*)veci_begin(ws));
    }

    return confl;
}